

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O2

void __thiscall bgui::ImageWindow::onMousePressed(ImageWindow *this,Button b,int x,int y,int state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImageAdapterBase *pIVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  uint uVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined1 auVar16 [16];
  int h;
  double local_78;
  undefined8 uStack_70;
  int w;
  undefined4 uStack_64;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  switch(b) {
  case button1:
    uVar9 = x + this->imx;
    this->xp = uVar9;
    this->yp = this->imy + y;
    if (((((state & 0x20U) == 0) || ((int)uVar9 < 0 || this->adapt == (ImageAdapterBase *)0x0)) ||
        (iVar6 = (*this->adapt->_vptr_ImageAdapterBase[0xb])(),
        CONCAT44(extraout_var,iVar6) <= (long)(ulong)uVar9)) ||
       ((iVar6 = this->yp, (long)iVar6 < 0 ||
        (iVar7 = (*this->adapt->_vptr_ImageAdapterBase[0xc])(),
        CONCAT44(extraout_var_00,iVar7) <= (long)iVar6)))) {
LAB_0010f8a8:
      updateInfo(this);
      return;
    }
    this->showinfo = false;
    (*this->adapt->_vptr_ImageAdapterBase[10])(&w,this->adapt,(long)this->xp,(long)this->yp);
    iVar6 = BaseWindow::getTextHeight(&this->super_BaseWindow);
    BaseWindow::setInfoLine(&this->super_BaseWindow,(char *)CONCAT44(uStack_64,w),iVar6 < y,true);
    goto LAB_0010f953;
  case button3:
    uVar9 = x + this->imx;
    this->xp = uVar9;
    this->yp = this->imy + y;
    if ((int)uVar9 < 0 || this->adapt == (ImageAdapterBase *)0x0) {
      return;
    }
    iVar6 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
    if (CONCAT44(extraout_var_01,iVar6) <= (long)(ulong)uVar9) {
      return;
    }
    iVar6 = this->yp;
    if ((long)iVar6 < 0) {
      return;
    }
    iVar7 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
    if (CONCAT44(extraout_var_02,iVar7) <= (long)iVar6) {
      return;
    }
    this->showinfo = false;
    (*this->adapt->_vptr_ImageAdapterBase[10])(&w,this->adapt,(long)this->xp,(long)this->yp);
    iVar6 = BaseWindow::getTextHeight(&this->super_BaseWindow);
    BaseWindow::setInfoLine(&this->super_BaseWindow,(char *)CONCAT44(uStack_64,w),iVar6 < y,true);
LAB_0010f953:
    std::__cxx11::string::~string((string *)&w);
    break;
  case button4:
    BaseWindow::setInfoLine(&this->super_BaseWindow,"",true,true);
    if (this->adapt != (ImageAdapterBase *)0x0) {
      dVar11 = this->adapt->scale;
      local_38._8_8_ = (double)y;
      local_38._0_8_ = (double)x;
      uVar1 = this->imx;
      uVar3 = this->imy;
      auVar16._0_8_ = (double)(uVar1 + x);
      auVar16._8_8_ = (double)(uVar3 + y);
      auVar13._8_8_ = dVar11;
      auVar13._0_8_ = dVar11;
      local_48 = divpd(auVar16,auVar13);
      dVar11 = log(1.0 / dVar11);
      dVar11 = floor(dVar11 / 0.6931471805599453);
      dVar11 = exp2(dVar11);
      dVar11 = 1.0 / dVar11;
      uVar10 = -(ulong)(this->adapt->scale == dVar11);
      dVar11 = (double)(~uVar10 & (ulong)dVar11 | (ulong)(dVar11 + dVar11) & uVar10);
      this->adapt->scale = dVar11;
      this->imx = (int)(long)(dVar11 * (double)local_48._0_8_ - (double)local_38._0_8_);
      this->imy = (int)(long)(dVar11 * (double)local_48._8_8_ - (double)local_38._8_8_);
      redrawImage(this,true);
      goto LAB_0010f8a8;
    }
    break;
  case button5:
    pIVar5 = this->adapt;
    if (pIVar5 != (ImageAdapterBase *)0x0) {
      local_78 = pIVar5->scale;
      uStack_70 = 0;
      uVar2 = this->imx;
      uVar4 = this->imy;
      local_48._4_4_ = y;
      local_48._0_4_ = x;
      local_48._8_8_ = 0;
      auVar14._0_8_ = (double)(uVar2 + x);
      auVar14._8_8_ = (double)(uVar4 + y);
      auVar12._8_8_ = local_78;
      auVar12._0_8_ = local_78;
      local_38 = divpd(auVar14,auVar12);
      pIVar5->scale = 1.0;
      iVar6 = (*pIVar5->_vptr_ImageAdapterBase[0xb])();
      iVar7 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
      BaseWindow::getSize(&this->super_BaseWindow,&w,&h);
      dVar11 = log(1.0 / local_78);
      dVar11 = floor(dVar11 / 0.6931471805599453 + 1e-06);
      dVar11 = exp2(dVar11);
      uVar15 = 0;
      dVar11 = (1.0 / dVar11) * 0.5;
      pIVar5 = this->adapt;
      pIVar5->scale = dVar11;
      if (dVar11 < 1.0) {
        uStack_70 = 0;
        local_78 = dVar11;
        iVar8 = (*pIVar5->_vptr_ImageAdapterBase[0xb])();
        if ((CONCAT44(extraout_var_05,iVar8) < (long)w) &&
           (iVar8 = (*this->adapt->_vptr_ImageAdapterBase[0xc])(),
           CONCAT44(extraout_var_06,iVar8) < (long)h)) {
          local_78 = (double)w / (double)CONCAT44(extraout_var_03,iVar6);
          pIVar5 = this->adapt;
          pIVar5->scale = local_78;
          uStack_70 = uVar15;
          iVar6 = (*pIVar5->_vptr_ImageAdapterBase[0xc])();
          if ((long)h < CONCAT44(extraout_var_07,iVar6)) {
            local_78 = (double)h / (double)CONCAT44(extraout_var_04,iVar7);
            this->adapt->scale = local_78;
            uStack_70 = uVar15;
          }
        }
        dVar11 = local_78;
        if (1.0 < local_78) {
          this->adapt->scale = 1.0;
          dVar11 = 1.0;
        }
      }
      this->imx = (int)(long)((double)local_38._0_8_ * dVar11 - (double)local_48._0_4_);
      this->imy = (int)(long)((double)local_38._8_8_ * dVar11 - (double)local_48._4_4_);
      redrawImage(this,true);
      updateInfo(this);
    }
  }
  return;
}

Assistant:

void ImageWindow::onMousePressed(Button b, int x, int y, int state)
{
  switch (b)
  {
    case button1:
      // store for panning

      xp=x+imx;
      yp=y+imy;

      if ((state & shiftmask) != 0 && adapt != 0 && xp >= 0 &&
          xp < adapt->getWidth() && yp >= 0 && yp < adapt->getHeight())
      {
        showinfo=false;
        setInfoLine(adapt->getDescriptionOfPixel(xp, yp).c_str(), y > getTextHeight());
      }
      else
      {
        updateInfo();
      }

      break;

    case button3:
      xp=x+imx;
      yp=y+imy;

      if (adapt != 0 && xp >= 0 && xp < adapt->getWidth() && yp >= 0 &&
          yp < adapt->getHeight())
      {
        showinfo=false;
        setInfoLine(adapt->getDescriptionOfPixel(xp, yp).c_str(), y > getTextHeight());
      }

      break;

    case button4:
      setInfoLine("");

      if (adapt != 0)
      {
        double s=adapt->getScale();
        double xx=(x+imx)/s;
        double yy=(y+imy)/s;

        s=1.0/pow(2.0, floor(log(1.0/s)/log(2.0)));

        if (s == adapt->getScale())
        {
          s*=2;
        }

        adapt->setScale(s);

        imx=static_cast<long>(xx*s-x);
        imy=static_cast<long>(yy*s-y);

        redrawImage();
        updateInfo();
      }

      break;

    case button5:
      if (adapt != 0)
      {
        double s=adapt->getScale();
        double xx=(x+imx)/s;
        double yy=(y+imy)/s;
        int    w, h;
        long   iw, ih;

        adapt->setScale(1.0);
        iw=adapt->getWidth();
        ih=adapt->getHeight();

        getSize(w, h);

        s=1.0/pow(2.0, floor(log(1.0/s)/log(2.0)+1e-6));

        s/=2;

        adapt->setScale(s);

        if (s < 1)
        {
          if (adapt->getWidth() < w && adapt->getHeight() < h)
          {
            s=static_cast<double>(w)/iw;
            adapt->setScale(s);

            if (adapt->getHeight() > h)
            {
              s=static_cast<double>(h)/ih;
              adapt->setScale(s);
            }
          }

          if (s > 1)
          {
            s=1;
            adapt->setScale(s);
          }
        }

        imx=static_cast<long>(xx*s-x);
        imy=static_cast<long>(yy*s-y);

        redrawImage();
        updateInfo();
      }

      break;

    default:
      break;
  }
}